

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiPopupData *pIVar3;
  long in_RDI;
  ImGuiWindow *popup_window;
  int n;
  bool ref_window_is_descendent_of_popup;
  ImGuiPopupData *popup;
  int popup_count_to_keep;
  ImGuiContext *g;
  int local_30;
  undefined1 in_stack_ffffffffffffffe3;
  int remaining;
  
  pIVar2 = GImGui;
  if ((GImGui->OpenPopupStack).Size != 0) {
    local_30 = 0;
    remaining = local_30;
    if (in_RDI != 0) {
      for (; remaining = local_30, local_30 < (pIVar2->OpenPopupStack).Size; local_30 = local_30 + 1
          ) {
        pIVar3 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,local_30);
        if ((pIVar3->Window != (ImGuiWindow *)0x0) && ((pIVar3->Window->Flags & 0x1000000U) == 0)) {
          bVar1 = false;
          remaining = local_30;
          for (; local_30 < (pIVar2->OpenPopupStack).Size; local_30 = local_30 + 1) {
            pIVar3 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,local_30);
            if ((pIVar3->Window != (ImGuiWindow *)0x0) &&
               (pIVar3->Window->RootWindow == *(ImGuiWindow **)(in_RDI + 0x390))) {
              bVar1 = true;
              break;
            }
          }
          local_30 = remaining;
          if (!bVar1) break;
        }
      }
    }
    if (remaining < (pIVar2->OpenPopupStack).Size) {
      ClosePopupToLevel(remaining,(bool)in_stack_ffffffffffffffe3);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}